

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

void __thiscall FListMenuItemStaticText::Drawer(FListMenuItemStaticText *this,bool selected)

{
  int iVar1;
  int local_28;
  int local_24;
  int x_1;
  int x;
  char *text;
  bool selected_local;
  FListMenuItemStaticText *this_local;
  
  _x_1 = this->mText;
  if (_x_1 != (char *)0x0) {
    if (*_x_1 == '$') {
      _x_1 = FStringTable::operator()(&GStrings,_x_1 + 1);
    }
    if ((this->super_FListMenuItem).mYpos < 0) {
      local_28 = ((this->super_FListMenuItem).mXpos + -0xa0) * CleanXfac;
      iVar1 = DCanvas::GetWidth((DCanvas *)screen);
      local_28 = local_28 + (iVar1 >> 1);
      if ((this->mCentered & 1U) != 0) {
        iVar1 = FFont::StringWidth(this->mFont,_x_1);
        local_28 = local_28 - (iVar1 * CleanXfac) / 2;
      }
      DCanvas::DrawText((DCanvas *)screen,this->mFont,this->mColor,local_28,
                        -(this->super_FListMenuItem).mYpos * CleanYfac,_x_1,0x40001393,1,0);
    }
    else {
      local_24 = (this->super_FListMenuItem).mXpos;
      if ((this->mCentered & 1U) != 0) {
        iVar1 = FFont::StringWidth(this->mFont,_x_1);
        local_24 = local_24 - iVar1 / 2;
      }
      DCanvas::DrawText((DCanvas *)screen,this->mFont,this->mColor,local_24,
                        (this->super_FListMenuItem).mYpos,_x_1,0x40001390,1,0);
    }
  }
  return;
}

Assistant:

void FListMenuItemStaticText::Drawer(bool selected)
{
	const char *text = mText;
	if (text != NULL)
	{
		if (*text == '$') text = GStrings(text+1);
		if (mYpos >= 0)
		{
			int x = mXpos;
			if (mCentered) x -= mFont->StringWidth(text)/2;
			screen->DrawText(mFont, mColor, x, mYpos, text, DTA_Clean, true, TAG_DONE);
		}
		else
		{
			int x = (mXpos - 160) * CleanXfac + (SCREENWIDTH>>1);
			if (mCentered) x -= (mFont->StringWidth(text)*CleanXfac)/2;
			screen->DrawText (mFont, mColor, x, -mYpos*CleanYfac, text, DTA_CleanNoMove, true, TAG_DONE);
		}
	}
}